

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_2610::convert_bottom_up_to_top_down
               (uint8_t *triplet_buffer,size_t width,size_t height,size_t stride)

{
  uchar *puVar1;
  long lVar2;
  size_t bottom_row;
  size_t i;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp_row;
  size_t row_length;
  size_t stride_local;
  size_t height_local;
  size_t width_local;
  uint8_t *triplet_buffer_local;
  
  temp_row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(width * 3);
  std::allocator<unsigned_char>::allocator(&local_49);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (size_type)(width * 3),&local_49);
  std::allocator<unsigned_char>::~allocator(&local_49);
  for (bottom_row = 0; bottom_row != height >> 1; bottom_row = bottom_row + 1) {
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    memcpy(puVar1,triplet_buffer + bottom_row * stride,
           (size_t)temp_row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    lVar2 = (height - bottom_row) + -1;
    memcpy(triplet_buffer + bottom_row * stride,triplet_buffer + lVar2 * stride,
           (size_t)temp_row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    memcpy(triplet_buffer + lVar2 * stride,puVar1,
           (size_t)temp_row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void convert_bottom_up_to_top_down(uint8_t* triplet_buffer, const size_t width, const size_t height, const size_t stride)
{
    const size_t row_length{width * bytes_per_rgb_pixel};
    std::vector<uint8_t> temp_row(row_length);

    for (size_t i{}; i != height / 2; ++i)
    {
        memcpy(temp_row.data(), &triplet_buffer[i * stride], row_length);
        const size_t bottom_row{height - i - 1};
        memcpy(&triplet_buffer[i * stride], &triplet_buffer[bottom_row * stride], row_length);
        memcpy(&triplet_buffer[bottom_row * stride], temp_row.data(), row_length);
    }
}